

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

int as154x(double *inp,int N,double *xreg,int optmethod,int p,int d,int q,int s,int P,int D,int Q,
          double *phi,double *theta,double *PHI,double *THETA,double *exog,int r,double *wmean,
          double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean)

{
  size_t __size;
  double dVar1;
  bool bVar2;
  int q_00;
  int P_00;
  int Q_00;
  double *sig;
  uint N_00;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  double *pdVar7;
  double *oup;
  double *__dest;
  double *A;
  reg_object obj;
  double *pdVar8;
  double *pdVar9;
  xlik_object __ptr;
  double *pdVar10;
  double *dx;
  int *ipiv;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  void *pvVar17;
  void *pvVar18;
  int iVar19;
  long lVar20;
  undefined4 in_register_00000084;
  int M;
  ulong uVar21;
  int iVar22;
  size_t sVar23;
  void *pvVar24;
  undefined1 local_100 [8];
  custom_function as154_min;
  void *local_d0;
  
  pdVar7 = phi;
  Q_00 = Q;
  iVar19 = D;
  P_00 = P;
  iVar5 = s;
  q_00 = q;
  N_00 = 0;
  if (xreg != (double *)0x0) {
    N_00 = r;
  }
  uVar15 = (ulong)(uint)Q;
  uVar13 = (ulong)(uint)P;
  uVar12 = (ulong)(uint)q;
  if (cssml == 1) {
    iVar3 = cssx(inp,N,xreg,optmethod,p,d,q,s,P,D,Q,phi,theta,PHI,THETA,exog,r,wmean,var,loglik,hess
                 ,start,imean);
    if (iVar3 != 1) {
      return iVar3;
    }
    iVar3 = checkroots_cerr(pdVar7,(int *)CONCAT44(in_register_00000084,p),theta,&q,PHI,&P,THETA,&Q)
    ;
    if (iVar3 == 10) {
      return 10;
    }
    if (iVar3 == 0xc) {
      return 0xc;
    }
  }
  else if (start == 0) {
    if (0 < p) {
      memset(phi,0,(ulong)(uint)p << 3);
    }
    if (0 < q_00) {
      memset(theta,0,uVar12 << 3);
    }
    if (0 < P_00) {
      memset(PHI,0,uVar13 << 3);
    }
    if (0 < Q_00) {
      memset(THETA,0,uVar15 << 3);
    }
  }
  iVar3 = iVar19 * iVar5;
  iVar22 = N - iVar3;
  lVar20 = (long)iVar22;
  pdVar7 = (double *)malloc(lVar20 * 8);
  if (iVar19 < 1) {
    uVar21 = (ulong)(uint)N;
    if (0 < N) {
      memcpy(pdVar7,inp,(ulong)(uint)N << 3);
      uVar21 = (ulong)(uint)N;
    }
  }
  else {
    uVar4 = diffs(inp,N,iVar19,iVar5,pdVar7);
    uVar21 = (ulong)uVar4;
  }
  iVar5 = (int)uVar21;
  oup = (double *)malloc((long)(iVar5 - d) << 3);
  if (d < 1) {
    if (0 < iVar5) {
      memcpy(oup,pdVar7,uVar21 << 3);
    }
  }
  else {
    uVar4 = diff(pdVar7,iVar5,d,oup);
    uVar21 = (ulong)uVar4;
  }
  lVar16 = (long)N;
  lVar14 = lVar16 * 8;
  iVar5 = r + 1;
  __dest = (double *)malloc(lVar14 * iVar5);
  iVar19 = -D;
  bVar2 = imean != 1;
  if (bVar2 || iVar19 != d) {
    if (0 < (int)N_00) {
      memcpy(__dest,xreg,(ulong)N_00 * lVar14);
      N_00 = r;
    }
  }
  else {
    if (0 < N) {
      uVar11 = 0;
      do {
        __dest[uVar11] = 1.0;
        uVar11 = uVar11 + 1;
      } while ((uint)N != uVar11);
    }
    if (0 < r) {
      memcpy(__dest + lVar16,xreg,(ulong)(uint)r * lVar14);
    }
    N_00 = N_00 + 1;
  }
  pvVar17 = (void *)(ulong)N_00;
  M = (int)uVar21;
  sVar23 = (long)M * 8;
  A = (double *)malloc((long)iVar5 * sVar23);
  pvVar18 = pvVar17;
  if (0 < (int)N_00) {
    pdVar8 = __dest;
    pdVar9 = A;
    pdVar10 = __dest;
    iVar5 = N;
    if (0 < D) {
      do {
        diffs(pdVar8,N,D,s,pdVar9);
        memcpy(pdVar10,pdVar9,lVar20 * 8);
        pvVar18 = (void *)((long)pvVar18 + -1);
        pdVar8 = pdVar8 + lVar16;
        pdVar9 = pdVar9 + lVar20;
        pdVar10 = pdVar10 + lVar20;
        iVar5 = iVar22;
      } while (pvVar18 != (void *)0x0);
    }
    if (0 < d) {
      pvVar18 = pvVar17;
      pdVar8 = __dest;
      pdVar9 = A;
      do {
        diff(pdVar8,iVar5,d,pdVar9);
        pdVar9 = pdVar9 + M;
        pdVar8 = pdVar8 + iVar5;
        pvVar18 = (void *)((long)pvVar18 + -1);
      } while (pvVar18 != (void *)0x0);
    }
    if (iVar19 == d) {
      memcpy(A,__dest,(long)pvVar17 * sVar23);
    }
    iVar5 = rank(A,M,N_00);
    if (iVar5 < (int)N_00) {
      puts("Exogenous Variables are collinear. ");
      free(pdVar7);
      free(__dest);
      free(A);
      free(oup);
      return 7;
    }
    obj = reg_init(M,N_00);
    __size = (long)pvVar17 * 8;
    pdVar8 = (double *)malloc(__size * (long)pvVar17);
    pdVar9 = (double *)malloc(sVar23);
    pvVar18 = malloc(__size);
    local_d0 = malloc(__size);
    lVar20 = 0;
    setIntercept(obj,0);
    regress(obj,A,oup,pdVar9,pdVar8,0.95);
    pvVar24 = pvVar17;
    do {
      *(undefined8 *)((long)pvVar18 + lVar20) =
           *(undefined8 *)((long)&obj->beta[0].value + lVar20 * 4);
      *(double *)((long)local_d0 + lVar20) =
           *(double *)((long)&obj->beta[0].stdErr + lVar20 * 4) * 10.0;
      lVar20 = lVar20 + 8;
      pvVar24 = (void *)((long)pvVar24 + -1);
    } while (pvVar24 != (void *)0x0);
    free(pdVar8);
    free(pdVar9);
    free_reg(obj);
  }
  __ptr = xlik_init(p,d,q_00,s,P_00,D,Q_00,N_00,M);
  iVar5 = __ptr->offset;
  __ptr->N = M;
  __ptr->M = N_00;
  __ptr->mean = *wmean;
  iVar22 = __ptr->pq;
  lVar20 = (long)iVar22;
  sVar23 = lVar20 * 8;
  pdVar8 = (double *)malloc(sVar23);
  pdVar9 = (double *)malloc(sVar23);
  pdVar10 = (double *)malloc(sVar23 * lVar20);
  dx = (double *)malloc(sVar23);
  ipiv = (int *)malloc(lVar20 * 4);
  if (0 < p) {
    memcpy(pdVar8,phi,(ulong)(uint)p << 3);
  }
  if (0 < q_00) {
    uVar11 = 0;
    do {
      pdVar8[(long)p + uVar11] = -theta[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  if (0 < P_00) {
    uVar11 = 0;
    do {
      pdVar8[(long)(q_00 + p) + uVar11] = PHI[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  if (0 < Q_00) {
    uVar11 = 0;
    do {
      pdVar8[(long)(q_00 + p + P_00) + uVar11] = -THETA[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
  }
  if (0 < (int)N_00) {
    pvVar24 = (void *)0x0;
    do {
      pdVar8[(long)(q_00 + p + P_00 + Q_00) + (long)pvVar24] =
           *(double *)((long)pvVar18 + (long)pvVar24 * 8);
      pvVar24 = (void *)((long)pvVar24 + 1);
    } while (pvVar17 != pvVar24);
  }
  __ptr->mean = 0.0;
  if (0 < M) {
    uVar11 = 0;
    do {
      dVar1 = oup[uVar11];
      __ptr->x[(long)(iVar5 + M * 2) + uVar11] = dVar1;
      __ptr->x[(long)iVar5 + uVar11] = dVar1;
      uVar11 = uVar11 + 1;
    } while (uVar21 != uVar11);
  }
  if (M < M * 2) {
    memset(__ptr->x + (iVar5 + M),0,(ulong)(M - 1) * 8 + 8);
  }
  if ((0 < (int)N_00) && (M * 3 < (int)((N_00 + 3) * M))) {
    memcpy(__ptr->x + (M * 3 + iVar5),A,(ulong)(M * N_00 - 1) * 8 + 8);
  }
  local_100 = (undefined1  [8])fas154x_seas;
  as154_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar4 = fminunc((custom_function *)local_100,(custom_gradient *)0x0,iVar22,pdVar8,1.0,optmethod,
                  pdVar9);
  if ((0xf < uVar4) || ((0x8011U >> (uVar4 & 0x1f) & 1) == 0)) {
    uVar4 = 1;
  }
  if (0 < q_00) {
    invertroot(q_00,pdVar9 + p);
  }
  if (0 < Q_00) {
    invertroot(Q_00,pdVar9 + (long)p + (long)q_00 + (long)P_00);
  }
  sig = hess;
  uVar6 = iVar22 - N_00;
  if (uVar6 != 0 && (int)N_00 <= iVar22) {
    uVar11 = 0;
    do {
      dx[uVar11] = 1.0;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  if (0 < (int)N_00) {
    pvVar24 = (void *)0x0;
    do {
      dx[(long)(int)uVar6 + (long)pvVar24] = *(double *)((long)local_d0 + (long)pvVar24 * 8);
      pvVar24 = (void *)((long)pvVar24 + 1);
    } while (pvVar17 != pvVar24);
  }
  as154_min.params = pvVar18;
  hessian_fd((custom_function *)local_100,pdVar9,iVar22,dx,__ptr->eps,hess);
  mtranspose(sig,iVar22,iVar22,pdVar10);
  if (iVar22 != 0) {
    uVar11 = 0;
    do {
      pdVar10[uVar11] = (sig[uVar11] + pdVar10[uVar11]) * (double)(N - (iVar3 + d)) * 0.5;
      uVar11 = uVar11 + 1;
    } while (iVar22 * iVar22 + (uint)(iVar22 * iVar22 == 0) != uVar11);
  }
  ludecomp(pdVar10,iVar22,ipiv);
  minverse(pdVar10,iVar22,ipiv,sig);
  if (0 < p) {
    memcpy(phi,pdVar9,(ulong)(uint)p << 3);
  }
  if (0 < q_00) {
    uVar11 = 0;
    do {
      theta[uVar11] = -pdVar9[(long)p + uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  if (0 < P_00) {
    uVar12 = 0;
    do {
      PHI[uVar12] = pdVar9[(long)(q_00 + p) + uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  if (0 < Q_00) {
    uVar13 = 0;
    do {
      THETA[uVar13] = -pdVar9[(long)(q_00 + p + P_00) + uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  if (bVar2 || iVar19 != d) {
    *wmean = 0.0;
    if (0 < (int)N_00) {
      pvVar18 = (void *)0x0;
      do {
        exog[(long)pvVar18] = pdVar9[(long)(q_00 + p + P_00 + Q_00) + (long)pvVar18];
        pvVar18 = (void *)((long)pvVar18 + 1);
      } while (pvVar17 != pvVar18);
    }
  }
  else {
    lVar20 = (long)(q_00 + p + P_00 + Q_00);
    *wmean = pdVar9[lVar20];
    if (1 < (int)N_00) {
      lVar14 = 0;
      do {
        exog[lVar14] = pdVar9[lVar20 + lVar14 + 1];
        lVar14 = lVar14 + 1;
      } while ((long)pvVar17 + -1 != lVar14);
    }
  }
  *var = __ptr->ssq / (double)M;
  if (0 < M) {
    uVar15 = 0;
    do {
      resid[uVar15] = __ptr->x[(long)(iVar5 + M) + uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar21 != uVar15);
  }
  *loglik = __ptr->loglik;
  free(pdVar8);
  free(pdVar9);
  free(oup);
  free(pdVar10);
  free(ipiv);
  free(dx);
  free(pdVar7);
  free(__dest);
  free(A);
  if (0 < (int)N_00) {
    free(as154_min.params);
    free(local_d0);
  }
  free(__ptr);
  return uVar4;
}

Assistant:

int as154x(double *inp, int N, double *xreg, int optmethod, int p, int d, int q, int s, int P, int D, int Q, double *phi, double *theta, 
 	double *PHI, double *THETA, double *exog, int r, double *wmean, double *var,double *resid,double *loglik,double *hess,int cssml,int start,int imean) {
	int i,pq,retval,length,ret,ncxreg,nd,offset,N1,rnk,orig,ERR;
	double *b,*tf,*x,*dx,*thess,*XX,*varcovar,*res,*x0,*inp2,*U,*V,*SIG,*coeff,*sigma;
	int *ipiv;
	double maxstep;
	xlik_object obj;
	reg_object fit;

	length = N;// length of xreg as x is differenced first
	
	maxstep = 1.0;
	ncxreg = (xreg == NULL) ? 0 : r;
	nd = d + D;

	if (cssml == 1) {
		ERR = cssx(inp, N, xreg, optmethod, p, d, q, s, P, D, Q, phi, theta, PHI, THETA,exog,r, wmean, var, loglik, hess,start,imean);

		if ( ERR != 1) return ERR;

		ERR = checkroots_cerr(phi, &p, theta, &q, PHI, &P, THETA, &Q);
		if (ERR == 10 || ERR == 12) return ERR;
	}
	else {

		if (start == 0) {
			for (i = 0; i < p; ++i) phi[i] = 0.0;
			for (i = 0; i < q; ++i) theta[i] = 0.0;
			for (i = 0; i < P; ++i) PHI[i] = 0.0;
			for (i = 0; i < Q; ++i) THETA[i] = 0.0;
		}
	}

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	//mdisplay(x,1,N);

	x0 = (double*) malloc(sizeof(double)*length*(r+1));

	if (nd == 0 && imean == 1) {
		for(i = 0; i < length;++i) {
			x0[i] = 1.0;
		}
		if (r > 0) {
			memcpy(x0+length,xreg,sizeof(double)*r*length);
		}
		ncxreg++;
	} else {
		if (ncxreg > 0) {
			memcpy(x0,xreg,sizeof(double)*ncxreg*length);
		}
	}
	XX = (double*) malloc(sizeof(double)*N*(r+1));

	if (ncxreg > 0) {
		N1 = length;
		// x0 differenced and stored back in x0. Also stored in XX
		if (D > 0) {
			N1 = length - s*D;
			for(i = 0; i < ncxreg;++i) {
				diffs(x0+length*i,length,D,s,XX+N1*i);
				memcpy(x0+N1*i,XX+N1*i,sizeof(double)*N1);
			}
		} 
		// x0 differenced to XX
		if (d > 0) {
			for(i = 0; i < ncxreg;++i) {
				diff(x0+N1*i,N1,d,XX+N*i);
			}
		} 
		// Copy x0 to XX
		if (nd == 0) {
			memcpy(XX,x0,sizeof(double)*N*ncxreg);
		}

		rnk = rank(XX,N,ncxreg);

		if (rnk < ncxreg) {
			ERR = 7;
			printf("Exogenous Variables are collinear. \n");
			free(inp2);
			free(x0);
			free(XX);
			free(x);
			return ERR;
		}

	}


	orig = 0;

	if (ncxreg > 0) {
		if (ncxreg == 1) orig = 1;

		fit = reg_init(N,ncxreg);

		varcovar = (double*)malloc(sizeof(double)*ncxreg*ncxreg);
		res = (double*)malloc(sizeof(double)*N);
		coeff = (double*)malloc(sizeof(double)*ncxreg);
		sigma = (double*)malloc(sizeof(double)*ncxreg);

		setIntercept(fit,0);
		regress(fit,XX,x,res,varcovar,0.95);

		for(i = 0; i < ncxreg;++i) {
			coeff[i] = (fit->beta+i)->value;
			sigma[i] = 10.0 * (fit->beta+i)->stdErr;
			//printf("coeff %g sigma %g ",coeff[i],sigma[i]);
		}

		free(varcovar);
		free(res);
		free_reg(fit);
	}

	
 
	obj = xlik_init(p,d,q,s,P,D,Q,ncxreg,N);


	offset = obj->offset;

	obj->N = N;
	obj->M = ncxreg;
	obj->mean = *wmean;
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);


	// Initialize Parameters

	//mdisplay(theta,1,q);
	//mdisplay(THETA,1,Q);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = PHI[i];
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = -THETA[i];
	}

	if (ncxreg > 0) {
		for(i = 0; i < ncxreg;++i) {
			b[p + q + P + Q + i] = coeff[i]; // exog
		}
	}

	


	obj->mean = 0.0;

	// Set data vector

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}

	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	if (ncxreg > 0) {
		for(i = 3 * N; i < (3 + ncxreg)*N; ++i) {
			obj->x[offset + i] = XX[i - 3*N];
		}
	}


	custom_function as154_min = { fas154x_seas, obj };
	retval = fminunc(&as154_min, NULL, pq, b,maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	if (q > 0) {
		invertroot(q,tf+p);
	}

	if (Q > 0) {
		invertroot(Q,tf+p+q+P);
	}



	for (i = 0; i < pq - ncxreg; ++i) {
		dx[i] = 1.0;
	}

	for(i = 0; i < ncxreg; ++i) {
		dx[pq - ncxreg + i] = sigma[i];
	}

	hessian_fd(&as154_min, tf, pq, dx, obj->eps, hess);
	
	mtranspose(hess, pq, pq, thess);
	

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (length - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}
	

	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);


	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}
	

	if (nd == 0 && imean == 1) {
		*wmean = tf[p + q + Q + P];
		if (ncxreg > 1) {
			for(i = 1; i < ncxreg;++i) {
				exog[i-1] = tf[p + q + Q + P + i];
			}
		}
	} else {
		*wmean = 0.0;
		for(i = 0; i < ncxreg; ++i) {
			exog[i] = tf[p + q + Q + P + i];
		}
	}


	*var = (obj->ssq) / (double) N;

	for (i = 0; i < N; ++i) {
		resid[i] = obj->x[offset + N + i];
	}
	*loglik = obj->loglik;

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(ipiv);
	free(dx);
	free(inp2);
	free(x0);
	free(XX); 
	if (ncxreg > 0) {
		free(coeff);
		free(sigma);
	}
	
	free_xlik(obj);
	return ret;
}